

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O2

string * jwt::base::decode(string *__return_storage_ptr__,string *base,array<char,_64UL> *alphabet,
                          string *fill)

{
  __type _Var1;
  runtime_error *this;
  size_type sVar2;
  char cVar3;
  ulong offset;
  size_type sVar4;
  ulong offset_00;
  long local_58;
  anon_class_16_2_896cead7 get_sextet;
  
  sVar4 = base->_M_string_length;
  sVar2 = fill->_M_string_length;
  local_58 = 0;
  do {
    if (sVar4 <= sVar2) {
LAB_00106b56:
      if (((int)sVar4 - (int)local_58 & 3U) == 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
        offset_00 = sVar4 & 0xfffffffffffffffc;
        get_sextet.alphabet = alphabet;
        get_sextet.base = base;
        for (offset = 0; cVar3 = (char)__return_storage_ptr__, offset < offset_00;
            offset = offset + 4) {
          decode::anon_class_16_2_896cead7::operator()(&get_sextet,offset);
          decode::anon_class_16_2_896cead7::operator()(&get_sextet,offset + 1);
          decode::anon_class_16_2_896cead7::operator()(&get_sextet,offset + 2);
          decode::anon_class_16_2_896cead7::operator()(&get_sextet,offset + 3);
          std::__cxx11::string::push_back(cVar3);
          std::__cxx11::string::push_back(cVar3);
          std::__cxx11::string::push_back(cVar3);
        }
        if (local_58 != 0) {
          decode::anon_class_16_2_896cead7::operator()(&get_sextet,offset_00);
          decode::anon_class_16_2_896cead7::operator()(&get_sextet,offset_00 | 1);
          if (local_58 == -1) {
            decode::anon_class_16_2_896cead7::operator()(&get_sextet,offset_00 | 2);
            std::__cxx11::string::push_back(cVar3);
          }
          std::__cxx11::string::push_back(cVar3);
        }
        return __return_storage_ptr__;
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Invalid input");
      goto LAB_00106b40;
    }
    std::__cxx11::string::substr((ulong)&get_sextet,(ulong)base);
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &get_sextet,fill);
    std::__cxx11::string::~string((string *)&get_sextet);
    if (!_Var1) goto LAB_00106b56;
    sVar2 = fill->_M_string_length;
    sVar4 = sVar4 - sVar2;
    local_58 = local_58 + -1;
  } while (local_58 != -3);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Invalid input");
LAB_00106b40:
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static std::string decode(const std::string& base, const std::array<char, 64>& alphabet, const std::string& fill) {
			size_t size = base.size();

			size_t fill_cnt = 0;
			while (size > fill.size()) {
				if (base.substr(size - fill.size(), fill.size()) == fill) {
					fill_cnt++;
					size -= fill.size();
					if(fill_cnt > 2)
						throw std::runtime_error("Invalid input");
				}
				else break;
			}

			if ((size + fill_cnt) % 4 != 0)
				throw std::runtime_error("Invalid input");

			size_t out_size = size / 4 * 3;
			std::string res;
			res.reserve(out_size);

			auto get_sextet = [&](size_t offset) {
				for (size_t i = 0; i < alphabet.size(); i++) {
					if (alphabet[i] == base[offset])
						return static_cast<uint32_t>(i);
				}
				throw std::runtime_error("Invalid input");
			};

			
			size_t fast_size = size - size % 4;
			for (size_t i = 0; i < fast_size;) {
				uint32_t sextet_a = get_sextet(i++);
				uint32_t sextet_b = get_sextet(i++);
				uint32_t sextet_c = get_sextet(i++);
				uint32_t sextet_d = get_sextet(i++);

				uint32_t triple = (sextet_a << 3 * 6)
					+ (sextet_b << 2 * 6)
					+ (sextet_c << 1 * 6)
					+ (sextet_d << 0 * 6);

				res += (triple >> 2 * 8) & 0xFF;
				res += (triple >> 1 * 8) & 0xFF;
				res += (triple >> 0 * 8) & 0xFF;
			}

			if (fill_cnt == 0)
				return res;

			uint32_t triple = (get_sextet(fast_size) << 3 * 6)
				+ (get_sextet(fast_size + 1) << 2 * 6);

			switch (fill_cnt) {
			case 1:
				triple |= (get_sextet(fast_size + 2) << 1 * 6);
				res += (triple >> 2 * 8) & 0xFF;
				res += (triple >> 1 * 8) & 0xFF;
				break;
			case 2:
				res += (triple >> 2 * 8) & 0xFF;
				break;
			default:
				break;
			}

			return res;
		}